

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

string * __thiscall
Context::execute(string *__return_storage_ptr__,Context *this,string *input,
                shared_ptr<Session> *session)

{
  Session *this_00;
  bool bVar1;
  char cVar2;
  tm *__tp;
  ostream *poVar3;
  string *this_01;
  string actor;
  time_t now;
  char timestamp [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  Parser::Parser((Parser *)timestamp,input);
  Parser::actor_abi_cxx11_(&actor,(Parser *)timestamp);
  bVar1 = Grammar::is_type(&actor);
  if (bVar1) {
    execute_in_type_abi_cxx11_((string *)&now,this,(Parser *)timestamp);
LAB_0014cb32:
    this_01 = (string *)&now;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)this_01);
  }
  else {
    bVar1 = Grammar::is_context(&actor);
    if (bVar1) {
      execute_in_context_abi_cxx11_((string *)&now,this,(Parser *)timestamp);
      goto LAB_0014cb32;
    }
    bVar1 = Grammar::is_variable(&actor);
    if (bVar1) {
      execute_in_variable_abi_cxx11_((string *)&now,this,(Parser *)timestamp);
      goto LAB_0014cb32;
    }
    bVar1 = Grammar::is_connection(&actor);
    if (!bVar1) goto LAB_0014cb4a;
    this_00 = (session->super___shared_ptr<Session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    Parser::message_name_abi_cxx11_(&local_48,(Parser *)timestamp);
    Parser::arguments_abi_cxx11_(&local_60,(Parser *)timestamp);
    Session::receive((string *)&now,this_00,&local_48,&local_60);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&now);
    std::__cxx11::string::~string((string *)&now);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
    this_01 = &local_48;
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_0014cb4a:
  std::__cxx11::string::~string((string *)&actor);
  Parser::~Parser((Parser *)timestamp);
  now = time((time_t *)0x0);
  __tp = localtime(&now);
  strftime(timestamp,0x20,"[%F %T]",__tp);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    if (this->_is_quiet_mode != false) {
      return __return_storage_ptr__;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,timestamp);
    poVar3 = std::operator<<(poVar3," ");
    str_utils::trim(&actor,input);
    poVar3 = std::operator<<(poVar3,(string *)&actor);
    poVar3 = std::operator<<(poVar3," -> ");
    poVar3 = std::operator<<(poVar3,(string *)__return_storage_ptr__);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    poVar3 = std::operator<<((ostream *)this,timestamp);
    poVar3 = std::operator<<(poVar3," ");
    str_utils::trim(&actor,input);
    poVar3 = std::operator<<(poVar3,(string *)&actor);
    poVar3 = std::operator<<(poVar3," -> ");
    poVar3 = std::operator<<(poVar3,(string *)__return_storage_ptr__);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::__cxx11::string::~string((string *)&actor);
  return __return_storage_ptr__;
}

Assistant:

std::string Context::execute(const std::string& input, std::shared_ptr<Session> session) {
    std::string output;
    try {
        Parser parser(input);
        std::string actor = parser.actor();
        if (Grammar::is_type(actor))
            output = execute_in_type(parser);
        else if (Grammar::is_context(actor))
            output = execute_in_context(parser);
        else if (Grammar::is_variable(actor))
            output = execute_in_variable(parser);
        else if (Grammar::is_connection(actor))
            output = session->receive(parser.message_name(), parser.arguments());
    }
    catch (const char* exception) {
        output = std::string(exception);
    }
    catch (...) {
        output = std::string(EXC_UNKNOWN_ERROR);
    }
    char timestamp[32];
    time_t now = time(NULL);
    strftime(timestamp, sizeof(timestamp), "[%F %T]", localtime(&now));
    if (_logfile.is_open())
        _logfile << timestamp << " " << str_utils::trim(input) << " -> " << output << std::endl;
    else if (!_is_quiet_mode)
        std::cout << timestamp << " " << str_utils::trim(input) << " -> " << output << std::endl;
    return output;
}